

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param.cpp
# Opt level: O0

int __thiscall MeCab::Param::help_version(Param *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_stack_000000a0;
  Param *in_stack_000000a8;
  int local_4;
  
  bVar1 = get<bool>(in_stack_000000a8,in_stack_000000a0);
  if (bVar1) {
    pcVar2 = help((Param *)0x12458d);
    std::operator<<((ostream *)&std::cout,pcVar2);
    local_4 = 0;
  }
  else {
    bVar1 = get<bool>(in_stack_000000a8,in_stack_000000a0);
    if (bVar1) {
      pcVar2 = version((Param *)0x1245c5);
      std::operator<<((ostream *)&std::cout,pcVar2);
      local_4 = 0;
    }
    else {
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

int Param::help_version() const {
  if (get<bool>("help")) {
    std::cout << help();
    return 0;
  }

  if (get<bool>("version")) {
    std::cout << version();
    return 0;
  }

  return 1;
}